

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O2

void __thiscall
groundupdbext::EmbeddedDatabase::Impl::Impl(Impl *this,string *dbname,string *fullpath)

{
  KeyValueStore *pKVar1;
  undefined1 local_60 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  (this->super_IDatabase)._vptr_IDatabase = (_func_int **)&PTR__Impl_00138b20;
  std::__cxx11::string::string((string *)&this->m_name,(string *)dbname);
  std::__cxx11::string::string((string *)&this->m_fullpath,(string *)fullpath);
  (this->m_keyValueStore)._M_t.
  super___uniq_ptr_impl<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>.
  _M_t.
  super__Tuple_impl<0UL,_groundupdb::KeyValueStore_*,_std::default_delete<groundupdb::KeyValueStore>_>
  .super__Head_base<0UL,_groundupdb::KeyValueStore_*,_false>._M_head_impl = (KeyValueStore *)0x0;
  (this->m_indexStore)._M_t.
  super___uniq_ptr_impl<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>.
  _M_t.
  super__Tuple_impl<0UL,_groundupdb::KeyValueStore_*,_std::default_delete<groundupdb::KeyValueStore>_>
  .super__Head_base<0UL,_groundupdb::KeyValueStore_*,_false>._M_head_impl = (KeyValueStore *)0x0;
  std::make_unique<groundupdbext::FileKeyValueStore,std::__cxx11::string&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_60 + 0x18))
  ;
  local_60._16_8_ = local_48._M_dataplus._M_p;
  std::
  make_unique<groundupdbext::MemoryKeyValueStore,std::unique_ptr<groundupdb::KeyValueStore,std::default_delete<groundupdb::KeyValueStore>>&>
            ((unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>
              *)(local_60 + 0x18));
  pKVar1 = (this->m_keyValueStore)._M_t.
           super___uniq_ptr_impl<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>
           ._M_t.
           super__Tuple_impl<0UL,_groundupdb::KeyValueStore_*,_std::default_delete<groundupdb::KeyValueStore>_>
           .super__Head_base<0UL,_groundupdb::KeyValueStore_*,_false>._M_head_impl;
  (this->m_keyValueStore)._M_t.
  super___uniq_ptr_impl<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>.
  _M_t.
  super__Tuple_impl<0UL,_groundupdb::KeyValueStore_*,_std::default_delete<groundupdb::KeyValueStore>_>
  .super__Head_base<0UL,_groundupdb::KeyValueStore_*,_false>._M_head_impl =
       (KeyValueStore *)local_48._M_dataplus._M_p;
  if (pKVar1 != (KeyValueStore *)0x0) {
    (*(pKVar1->super_Store)._vptr_Store[1])();
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_60 + 0x18),fullpath,"/.indexes");
  std::make_unique<groundupdbext::FileKeyValueStore,std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  local_60._8_8_ = local_60._0_8_;
  local_60._0_8_ = (pointer)0x0;
  std::__cxx11::string::~string((string *)(local_60 + 0x18));
  std::
  make_unique<groundupdbext::MemoryKeyValueStore,std::unique_ptr<groundupdb::KeyValueStore,std::default_delete<groundupdb::KeyValueStore>>&>
            ((unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>
              *)(local_60 + 0x18));
  pKVar1 = (this->m_indexStore)._M_t.
           super___uniq_ptr_impl<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>
           ._M_t.
           super__Tuple_impl<0UL,_groundupdb::KeyValueStore_*,_std::default_delete<groundupdb::KeyValueStore>_>
           .super__Head_base<0UL,_groundupdb::KeyValueStore_*,_false>._M_head_impl;
  (this->m_indexStore)._M_t.
  super___uniq_ptr_impl<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>.
  _M_t.
  super__Tuple_impl<0UL,_groundupdb::KeyValueStore_*,_std::default_delete<groundupdb::KeyValueStore>_>
  .super__Head_base<0UL,_groundupdb::KeyValueStore_*,_false>._M_head_impl =
       (KeyValueStore *)local_48._M_dataplus._M_p;
  if (pKVar1 != (KeyValueStore *)0x0) {
    (*(pKVar1->super_Store)._vptr_Store[1])();
  }
  if ((long *)local_60._8_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_60._8_8_ + 8))();
  }
  if ((Store *)local_60._16_8_ != (Store *)0x0) {
    (*(*(_func_int ***)local_60._16_8_)[1])();
  }
  return;
}

Assistant:

EmbeddedDatabase::Impl::Impl(std::string dbname, std::string fullpath)
  : m_name(dbname), m_fullpath(fullpath)
{
  // Explicitly specify base type so it matches the make_unique expected class (KeyValueStore)
  std::unique_ptr<KeyValueStore> fileStore = std::make_unique<FileKeyValueStore>(fullpath);
  std::unique_ptr<KeyValueStore> memoryStore = std::make_unique<MemoryKeyValueStore>(fileStore);
  m_keyValueStore = std::move(memoryStore);

  // Explicitly specify base type so it matches the make_unique expected class (KeyValueStore)
  std::unique_ptr<KeyValueStore> fileIndexStore = std::make_unique<FileKeyValueStore>(fullpath + "/.indexes");
  std::unique_ptr<KeyValueStore> memIndexStore = std::make_unique<MemoryKeyValueStore>(fileIndexStore);
  m_indexStore = std::move(memIndexStore);
}